

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O3

void __thiscall
wasm::OptimizeInstructions::optimizeAddedConstants(wasm::Binary*)::ZeroRemover::visitBinary(wasm::
Binary__(void *this,Binary *curr)

{
  BinaryOp BVar1;
  ulong uVar2;
  uintptr_t uVar3;
  bool bVar4;
  Id IVar5;
  BinaryOp BVar6;
  Expression *pEVar7;
  Expression *pEVar8;
  EffectAnalyzer local_1a8;
  char local_31;
  
  uVar2 = (curr->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id;
  if ((uVar2 & 0xfffffffffffffffe) != 2) {
    return;
  }
  pEVar7 = curr->left;
  if (curr->left->_id != ConstId) {
    pEVar7 = (Expression *)0x0;
  }
  pEVar8 = curr->right;
  if (curr->right->_id != ConstId) {
    pEVar8 = (Expression *)0x0;
  }
  BVar1 = curr->op;
  BVar6 = AddInt64;
  if (uVar2 == 2) {
    BVar6 = AddInt32;
  }
  if (BVar1 == BVar6) {
    if ((pEVar7 == (Expression *)0x0) || (bVar4 = Literal::isZero((Literal *)(pEVar7 + 1)), !bVar4))
    {
      if (pEVar8 == (Expression *)0x0) {
        return;
      }
      bVar4 = Literal::isZero((Literal *)(pEVar8 + 1));
      if (!bVar4) {
        return;
      }
      pEVar7 = curr->left;
    }
    else {
      pEVar7 = curr->right;
    }
    Walker<ZeroRemover,_wasm::Visitor<ZeroRemover,_void>_>::replaceCurrent
              ((Walker<ZeroRemover,_wasm::Visitor<ZeroRemover,_void>_> *)this,pEVar7);
    return;
  }
  BVar6 = ShlInt64;
  if (uVar2 == 2) {
    BVar6 = ShlInt32;
  }
  if (BVar1 != BVar6) {
    BVar6 = MulInt64;
    if (uVar2 == 2) {
      BVar6 = MulInt32;
    }
    if (BVar1 != BVar6) {
      return;
    }
    if ((pEVar7 != (Expression *)0x0) && (bVar4 = Literal::isZero((Literal *)(pEVar7 + 1)), bVar4))
    {
      EffectAnalyzer::EffectAnalyzer
                (&local_1a8,*(PassOptions **)((long)this + 0xd8),*(Module **)((long)this + 0xd0),
                 curr->right);
      local_31 = true;
      if (local_1a8.trap == false) {
        local_31 = EffectAnalyzer::hasNonTrapSideEffects(&local_1a8);
      }
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree(&local_1a8.delegateTargets._M_t);
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree(&local_1a8.breakTargets._M_t);
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree(&local_1a8.globalsWritten._M_t);
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree(&local_1a8.mutableGlobalsRead._M_t);
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~_Rb_tree(&local_1a8.localsWritten._M_t);
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~_Rb_tree(&local_1a8.localsRead._M_t);
      if (local_1a8.funcEffectsMap.
          super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_1a8.funcEffectsMap.
                   super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      if (local_31 == '\0') goto LAB_0080125c;
    }
    if (pEVar8 == (Expression *)0x0) {
      return;
    }
    bVar4 = Literal::isZero((Literal *)(pEVar8 + 1));
    if (!bVar4) {
      return;
    }
    EffectAnalyzer::EffectAnalyzer
              (&local_1a8,*(PassOptions **)((long)this + 0xd8),*(Module **)((long)this + 0xd0),
               curr->left);
    if (local_1a8.trap == true) {
      EffectAnalyzer::~EffectAnalyzer(&local_1a8);
      return;
    }
    bVar4 = EffectAnalyzer::hasNonTrapSideEffects(&local_1a8);
    EffectAnalyzer::~EffectAnalyzer(&local_1a8);
    pEVar7 = pEVar8;
    if (bVar4) {
      return;
    }
    goto LAB_0080125c;
  }
  if ((pEVar7 == (Expression *)0x0) || (bVar4 = Literal::isZero((Literal *)(pEVar7 + 1)), !bVar4)) {
    if (pEVar8 == (Expression *)0x0) {
      return;
    }
    if (pEVar8->_id != ConstId) {
      __assert_fail("int(_id) == int(T::SpecificId)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm.h"
                    ,0x314,"T *wasm::Expression::cast() [T = wasm::Const]");
    }
    uVar3 = (pEVar8->type).id;
    if (uVar3 == 3) {
      if (*(long *)(pEVar8 + 2) != 3) {
        __assert_fail("type == Type::i64",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/literal.h"
                      ,0x121,"int64_t wasm::Literal::geti64() const");
      }
      IVar5 = pEVar8[1]._id & ArrayNewId;
    }
    else {
      if (uVar3 != 2) {
        handle_unreachable("unexpected type",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/bits.h"
                           ,0x4a);
      }
      if (*(long *)(pEVar8 + 2) != 2) {
        __assert_fail("type == Type::i32",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/literal.h"
                      ,0x118,"int32_t wasm::Literal::geti32() const");
      }
      IVar5 = pEVar8[1]._id & SIMDShuffleId;
    }
    if (IVar5 != InvalidId) {
      return;
    }
  }
  EffectAnalyzer::EffectAnalyzer
            (&local_1a8,*(PassOptions **)((long)this + 0xd8),*(Module **)((long)this + 0xd0),
             curr->right);
  bVar4 = false;
  if ((((local_1a8.trap == false) &&
       (bVar4 = false, local_1a8.localsWritten._M_t._M_impl.super__Rb_tree_header._M_node_count == 0
       )) && (bVar4 = false, local_1a8.danglingPop == false)) &&
     (local_1a8.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_node_count == 0)) {
    if ((((local_1a8.writesMemory == false) && (local_1a8.writesTable == false)) &&
        ((local_1a8.writesStruct == false &&
         ((local_1a8.writesArray == false && (local_1a8.isAtomic == false)))))) &&
       (local_1a8.calls == false)) {
      bVar4 = false;
      if ((local_1a8.throws_ == false) &&
         (local_1a8.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count == 0)) {
        if (local_1a8.branchesOut != false) goto LAB_008011c7;
        bVar4 = local_1a8.breakTargets._M_t._M_impl.super__Rb_tree_header._M_node_count == 0;
      }
    }
    else {
LAB_008011c7:
      bVar4 = false;
    }
  }
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree(&local_1a8.delegateTargets._M_t);
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree(&local_1a8.breakTargets._M_t);
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree(&local_1a8.globalsWritten._M_t);
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree(&local_1a8.mutableGlobalsRead._M_t);
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree(&local_1a8.localsWritten._M_t);
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree(&local_1a8.localsRead._M_t);
  if (local_1a8.funcEffectsMap.
      super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1a8.funcEffectsMap.
               super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (!bVar4) {
    return;
  }
  pEVar7 = curr->left;
LAB_0080125c:
  Walker<ZeroRemover,_wasm::Visitor<ZeroRemover,_void>_>::replaceCurrent
            ((Walker<ZeroRemover,_wasm::Visitor<ZeroRemover,_void>_> *)this,pEVar7);
  return;
}

Assistant:

void visitBinary(Binary* curr) {
        if (!curr->type.isInteger()) {
          return;
        }
        auto type = curr->type;
        auto* left = curr->left->dynCast<Const>();
        auto* right = curr->right->dynCast<Const>();
        // Canonicalization prefers an add instead of a subtract wherever
        // possible. That prevents a subtracted constant on the right,
        // as it would be added. And for a zero on the left, it can't be
        // removed (it is how we negate ints).
        if (curr->op == Abstract::getBinary(type, Abstract::Add)) {
          if (left && left->value.isZero()) {
            replaceCurrent(curr->right);
            return;
          }
          if (right && right->value.isZero()) {
            replaceCurrent(curr->left);
            return;
          }
        } else if (curr->op == Abstract::getBinary(type, Abstract::Shl)) {
          // shifting a 0 is a 0, or anything by 0 has no effect, all unless the
          // shift has side effects
          if (((left && left->value.isZero()) ||
               (right && Bits::getEffectiveShifts(right) == 0)) &&
              !EffectAnalyzer(passOptions, *getModule(), curr->right)
                 .hasSideEffects()) {
            replaceCurrent(curr->left);
            return;
          }
        } else if (curr->op == Abstract::getBinary(type, Abstract::Mul)) {
          // multiplying by zero is a zero, unless the other side has side
          // effects
          if (left && left->value.isZero() &&
              !EffectAnalyzer(passOptions, *getModule(), curr->right)
                 .hasSideEffects()) {
            replaceCurrent(left);
            return;
          }
          if (right && right->value.isZero() &&
              !EffectAnalyzer(passOptions, *getModule(), curr->left)
                 .hasSideEffects()) {
            replaceCurrent(right);
            return;
          }
        }
      }